

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnDataSegmentInitExpr_GlobalGet
          (SharedValidator *this,Location *loc,Var *global_var)

{
  Result RVar1;
  Result RVar2;
  bool bVar3;
  GlobalType ref_global;
  GlobalType local_80;
  Var local_78;
  
  local_80.type.enum_ = Any;
  local_80.mutable_ = true;
  Var::Var(&local_78,global_var);
  RVar1 = CheckGlobalIndex(this,&local_78,&local_80);
  bVar3 = RVar1.enum_ == Error;
  Var::~Var(&local_78);
  if (local_80.mutable_ == true) {
    RVar2 = PrintError(this,loc,"initializer expression cannot reference a mutable global");
    bVar3 = RVar2.enum_ == Error || RVar1.enum_ == Error;
  }
  RVar1 = CheckType(this,loc,local_80.type,(Type)0xffffffff,"data segment offset");
  RVar1.enum_._0_1_ = RVar1.enum_ == Error | bVar3;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnDataSegmentInitExpr_GlobalGet(const Location& loc,
                                                        Var global_var) {
  Result result = Result::Ok;
  GlobalType ref_global;
  result |= CheckGlobalIndex(global_var, &ref_global);

  if (ref_global.mutable_) {
    result |= PrintError(
        loc, "initializer expression cannot reference a mutable global");
  }

  result |= CheckType(loc, ref_global.type, Type::I32, "data segment offset");
  return result;
}